

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

shared_ptr<embree::Texture> embree::Texture::load(FileName *fileName)

{
  bool bVar1;
  iterator this;
  mapped_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<embree::Texture> sVar3;
  shared_ptr<embree::Texture> tex;
  Texture *in_stack_fffffffffffffec8;
  shared_ptr<embree::Texture> *in_stack_fffffffffffffed0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
  *this_01;
  string local_e0 [39];
  undefined1 local_b9;
  string local_b8 [32];
  long *local_98 [3];
  string local_80 [32];
  _Self local_60 [2];
  undefined1 in_stack_ffffffffffffffb7;
  FileName *in_stack_ffffffffffffffb8;
  _Self local_28 [3];
  long **local_10;
  
  this_01 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
             *)&stack0xffffffffffffffb8;
  embree::FileName::str_abi_cxx11_((FileName *)in_stack_fffffffffffffec8);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
                 *)in_stack_fffffffffffffec8,(key_type *)0x1b29ff);
  local_28[0]._M_node = this._M_node;
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
              *)in_stack_fffffffffffffec8);
  bVar1 = std::operator!=(local_28,local_60);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  if (bVar1) {
    embree::FileName::str_abi_cxx11_((FileName *)in_stack_fffffffffffffec8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
    ::operator[](this_01,(key_type *)in_RDI);
    std::shared_ptr<embree::Texture>::shared_ptr
              (in_stack_fffffffffffffed0,(shared_ptr<embree::Texture> *)in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_80);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    operator_new(0x1b2b03);
    local_b9 = 1;
    loadImage(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    embree::FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffec8);
    Texture((Texture *)this._M_node,(Ref<embree::Image> *)this_01,(string *)in_RDI);
    local_b9 = 0;
    std::shared_ptr<embree::Texture>::shared_ptr<embree::Texture,void>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_b8);
    local_10 = local_98;
    if (local_98[0] != (long *)0x0) {
      (**(code **)(*local_98[0] + 0x18))();
    }
    embree::FileName::str_abi_cxx11_((FileName *)in_stack_fffffffffffffec8);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<embree::Texture>_>_>_>
              ::operator[](this_01,(key_type *)in_RDI);
    std::shared_ptr<embree::Texture>::operator=
              (this_00,(shared_ptr<embree::Texture> *)in_stack_fffffffffffffec8);
    std::shared_ptr<embree::Texture>::shared_ptr
              (this_00,(shared_ptr<embree::Texture> *)in_stack_fffffffffffffec8);
    std::__cxx11::string::~string(local_e0);
    std::shared_ptr<embree::Texture>::~shared_ptr((shared_ptr<embree::Texture> *)0x1b2c21);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<embree::Texture>)
         sVar3.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> Texture::load(const FileName& fileName)
  {
    if (texture_cache.find(fileName.str()) != texture_cache.end())
      return texture_cache[fileName.str()];

    std::shared_ptr<Texture> tex(new Texture(loadImage(fileName),fileName));
    return texture_cache[fileName.str()] = tex;
  }